

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Int64Set::SerializeWithCachedSizes(Int64Set *this,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ulong *puVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong value;
  ulong uVar8;
  int index;
  uint value_00;
  
  if (0 < (this->values_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar3 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar3 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar3;
    }
    value_00 = this->_values_cached_byte_size_;
    if (iVar3 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar6 = (byte)value_00 | 0x80;
          uVar7 = value_00 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar2 = 0x3fff < value_00;
          value_00 = uVar7;
        } while (bVar2);
      }
      *pbVar6 = (byte)uVar7;
      iVar3 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar3;
      output->buffer_size_ = output->buffer_size_ - iVar3;
    }
    iVar3 = (this->values_).current_size_;
    if (0 < iVar3) {
      index = 0;
      do {
        puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->values_,index);
        value = *puVar4;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar6 = pbVar1;
          uVar8 = value;
          if (0x7f < value) {
            do {
              *pbVar6 = (byte)value | 0x80;
              uVar8 = value >> 7;
              pbVar6 = pbVar6 + 1;
              bVar2 = 0x3fff < value;
              value = uVar8;
            } while (bVar2);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        index = index + 1;
      } while (index != iVar3);
    }
  }
  return;
}

Assistant:

void Int64Set::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Int64Set)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 values = 1;
  if (this->values_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_values_cached_byte_size_);
  }
  for (int i = 0, n = this->values_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->values(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Int64Set)
}